

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filter_block.cc
# Opt level: O2

void __thiscall leveldb::FilterBlockBuilder::AddKey(FilterBlockBuilder *this,Slice *key)

{
  char *pcVar1;
  size_type local_20;
  
  pcVar1 = key->data_;
  local_20 = (this->keys_)._M_string_length;
  std::vector<unsigned_long,_std::allocator<unsigned_long>_>::emplace_back<unsigned_long>
            (&this->start_,&local_20);
  std::__cxx11::string::append((char *)&this->keys_,(ulong)pcVar1);
  return;
}

Assistant:

void FilterBlockBuilder::AddKey(const Slice& key) {
  Slice k = key;
  start_.push_back(keys_.size());
  keys_.append(k.data(), k.size());
}